

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AppTest.cpp
# Opt level: O3

void __thiscall
TApp_InSetWithDefault_Test::~TApp_InSetWithDefault_Test(TApp_InSetWithDefault_Test *this)

{
  (this->super_TApp).super_Test._vptr_Test = (_func_int **)&PTR__TApp_0019e9d8;
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&(this->super_TApp).args);
  CLI::App::~App(&(this->super_TApp).app);
  testing::Test::~Test((Test *)this);
  operator_delete(this);
  return;
}

Assistant:

TEST_F(TApp, InSetWithDefault) {

    std::string choice = "one";
    app.add_set("-q,--quick", choice, {"one", "two", "three"}, "", true);

    run();
    EXPECT_EQ("one", choice);
    app.reset();

    args = {"--quick", "two"};

    run();
    EXPECT_EQ("two", choice);

    app.reset();

    args = {"--quick", "four"};
    EXPECT_THROW(run(), CLI::ConversionError);
}